

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
GlobOpt::IsWorthSpecializingToInt32(GlobOpt *this,Instr *instr,Value *src1Val,Value *src2Val)

{
  OpCode OVar1;
  Opnd *src;
  Opnd *src_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  uint uVar5;
  bool bVar6;
  Opnd *dst;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1d46,"(instr)","instr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  src = instr->m_src1;
  src_00 = instr->m_src2;
  bVar3 = IsWorthSpecializingToInt32DueToSrc(this,src,src1Val);
  bVar6 = true;
  if (((!bVar3) &&
      ((((src2Val == (Value *)0x0 ||
         (bVar3 = IsWorthSpecializingToInt32DueToSrc(this,src_00,src2Val), !bVar3)) &&
        (dst = instr->m_dst, dst != (Opnd *)0x0)) &&
       ((bVar3 = IsWorthSpecializingToInt32DueToDst(this,dst), !bVar3 &&
        (bVar3 = IR::Opnd::IsEqual(dst,src), !bVar3)))))) &&
     ((src2Val == (Value *)0x0 ||
      ((bVar3 = IR::Opnd::IsEqual(dst,src_00), !bVar3 &&
       (bVar3 = IR::Opnd::IsEqual(src,src_00), !bVar3)))))) {
    do {
      while( true ) {
        instr = IR::Instr::GetNextRealInstrOrLabel(instr);
        OVar1 = instr->m_opcode;
        if (ProfiledLdSuperFld < OVar1) break;
        if ((0x39 < OVar1 - 0x5e) ||
           ((0x200000000001101U >> ((ulong)(OVar1 - 0x5e) & 0x3f) & 1) == 0)) {
          if ((OVar1 != Ld_A) || (bVar3 = IR::Opnd::IsEqual(dst,instr->m_src1), !bVar3))
          goto LAB_0045c948;
          dst = instr->m_dst;
        }
      }
    } while ((OVar1 == LdRootFldForTypeOf) || (OVar1 == ByteCodeUses));
LAB_0045c948:
    if (((instr->m_src1 != (Opnd *)0x0) && (bVar3 = IR::Opnd::IsEqual(dst,instr->m_src1), bVar3)) ||
       ((instr->m_src2 != (Opnd *)0x0 && (bVar3 = IR::Opnd::IsEqual(dst,instr->m_src2), bVar3)))) {
      uVar5 = instr->m_opcode - 0x26;
      if ((uVar5 < 0x1e) && ((0x200fad8fU >> (uVar5 & 0x1f) & 1) != 0)) {
        return true;
      }
      uVar5 = instr->m_opcode - 0x1a5;
      if ((uVar5 < 0xc) && ((0xaafU >> (uVar5 & 0x1f) & 1) != 0)) {
        return true;
      }
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool
GlobOpt::IsWorthSpecializingToInt32(IR::Instr *const instr, Value *const src1Val, Value *const src2Val)
{
    Assert(instr);

    const auto src1 = instr->GetSrc1();
    const auto src2 = instr->GetSrc2();

    // In addition to checking each operand and the destination, if for any reason we only have to do a maximum of two
    // conversions instead of the worst-case 3 conversions, it's probably worth specializing.
    if (IsWorthSpecializingToInt32DueToSrc(src1, src1Val) ||
        (src2Val && IsWorthSpecializingToInt32DueToSrc(src2, src2Val)))
    {
        return true;
    }

    IR::Opnd *dst = instr->GetDst();
    if (!dst || IsWorthSpecializingToInt32DueToDst(dst))
    {
        return true;
    }

    if (dst->IsEqual(src1) || (src2Val && (dst->IsEqual(src2) || src1->IsEqual(src2))))
    {
        return true;
    }

    IR::Instr *instrNext = instr->GetNextRealInstrOrLabel();

    // Skip useless Ld_A's
    do
    {
        switch (instrNext->m_opcode)
        {
        case Js::OpCode::Ld_A:
            if (!dst->IsEqual(instrNext->GetSrc1()))
            {
                goto done;
            }
            dst = instrNext->GetDst();
            break;
        case Js::OpCode::LdFld:
        case Js::OpCode::LdRootFld:
        case Js::OpCode::LdRootFldForTypeOf:
        case Js::OpCode::LdFldForTypeOf:
        case Js::OpCode::LdElemI_A:
        case Js::OpCode::ByteCodeUses:
            break;
        default:
            goto done;
        }

        instrNext = instrNext->GetNextRealInstrOrLabel();
    } while (true);
done:

    // If the next instr could also be type specialized, then it is probably worth it.
    if ((instrNext->GetSrc1() && dst->IsEqual(instrNext->GetSrc1())) || (instrNext->GetSrc2() && dst->IsEqual(instrNext->GetSrc2())))
    {
        switch (instrNext->m_opcode)
        {
        case Js::OpCode::Add_A:
        case Js::OpCode::Sub_A:
        case Js::OpCode::Mul_A:
        case Js::OpCode::Div_A:
        case Js::OpCode::Rem_A:
        case Js::OpCode::Xor_A:
        case Js::OpCode::And_A:
        case Js::OpCode::Or_A:
        case Js::OpCode::Shl_A:
        case Js::OpCode::Shr_A:
        case Js::OpCode::Incr_A:
        case Js::OpCode::Decr_A:
        case Js::OpCode::Neg_A:
        case Js::OpCode::Not_A:
        case Js::OpCode::Conv_Num:
        case Js::OpCode::BrEq_I4:
        case Js::OpCode::BrTrue_I4:
        case Js::OpCode::BrFalse_I4:
        case Js::OpCode::BrGe_I4:
        case Js::OpCode::BrGt_I4:
        case Js::OpCode::BrLt_I4:
        case Js::OpCode::BrLe_I4:
        case Js::OpCode::BrNeq_I4:
            return true;
        }
    }

    return false;
}